

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plain_server.cpp
# Opt level: O0

int __thiscall zmq::plain_server_t::next_handshake_command(plain_server_t *this,msg_t *msg_)

{
  int iVar1;
  int *piVar2;
  plain_server_t *in_RDI;
  msg_t *in_stack_00000008;
  plain_server_t *in_stack_00000010;
  int rc;
  msg_t *in_stack_ffffffffffffffd8;
  int local_14;
  
  local_14 = 0;
  iVar1 = *(int *)&(in_RDI->super_zap_client_common_handshake_t).super_zap_client_t.field_0x48;
  if (iVar1 == 1) {
    produce_welcome((msg_t *)in_RDI);
    *(undefined4 *)&(in_RDI->super_zap_client_common_handshake_t).super_zap_client_t.field_0x48 = 2;
  }
  else if (iVar1 == 4) {
    produce_ready(in_RDI,in_stack_ffffffffffffffd8);
    *(undefined4 *)&(in_RDI->super_zap_client_common_handshake_t).super_zap_client_t.field_0x48 = 7;
  }
  else if (iVar1 == 5) {
    produce_error(in_stack_00000010,in_stack_00000008);
    *(undefined4 *)&(in_RDI->super_zap_client_common_handshake_t).super_zap_client_t.field_0x48 = 6;
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 0xb;
    local_14 = -1;
  }
  return local_14;
}

Assistant:

int zmq::plain_server_t::next_handshake_command (msg_t *msg_)
{
    int rc = 0;

    switch (state) {
        case sending_welcome:
            produce_welcome (msg_);
            state = waiting_for_initiate;
            break;
        case sending_ready:
            produce_ready (msg_);
            state = ready;
            break;
        case sending_error:
            produce_error (msg_);
            state = error_sent;
            break;
        default:
            errno = EAGAIN;
            rc = -1;
    }
    return rc;
}